

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O1

coda_type_special * coda_type_vsf_integer_new(coda_format format)

{
  coda_type_special *pcVar1;
  coda_type_record *type;
  
  pcVar1 = (coda_type_special *)malloc(0x58);
  if (pcVar1 == (coda_type_special *)0x0) {
    pcVar1 = (coda_type_special *)0x0;
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x58,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0x8e1);
  }
  else {
    pcVar1->format = format;
    pcVar1->retain_count = 0;
    pcVar1->type_class = coda_special_class;
    pcVar1->read_type = coda_native_type_double;
    pcVar1->name = (char *)0x0;
    pcVar1->description = (char *)0x0;
    pcVar1->bit_size = -1;
    pcVar1->size_expr = (coda_expression *)0x0;
    pcVar1->attributes = (coda_type_record *)0x0;
    pcVar1->special_type = coda_special_vsf_integer;
    pcVar1->base_type = (coda_type *)0x0;
    pcVar1->unit = (char *)0x0;
    pcVar1->value_expr = (coda_expression *)0x0;
    type = coda_type_record_new(format);
    pcVar1->base_type = (coda_type *)type;
    coda_type_set_description((coda_type *)type,"Variable Scale Factor Integer");
  }
  return pcVar1;
}

Assistant:

coda_type_special *coda_type_vsf_integer_new(coda_format format)
{
    coda_type_special *type;

    type = (coda_type_special *)malloc(sizeof(coda_type_special));
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_type_special), __FILE__, __LINE__);
        return NULL;
    }
    type->format = format;
    type->retain_count = 0;
    type->type_class = coda_special_class;
    type->read_type = coda_native_type_double;
    type->name = NULL;
    type->description = NULL;
    type->bit_size = -1;
    type->size_expr = NULL;
    type->attributes = NULL;
    type->special_type = coda_special_vsf_integer;
    type->base_type = NULL;
    type->unit = NULL;
    type->value_expr = NULL;

    type->base_type = (coda_type *)coda_type_record_new(format);
    coda_type_set_description(type->base_type, "Variable Scale Factor Integer");

    return type;
}